

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasStringPieceFields(FileDescriptor *file,Options *options)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = 0 < *(int *)(file + 0x2c);
  if ((0 < *(int *)(file + 0x2c)) &&
     (bVar1 = HasStringPieceFields(*(Descriptor **)(file + 0x58),options), !bVar1)) {
    lVar4 = 0;
    lVar3 = 0x88;
    do {
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < *(int *)(file + 0x2c);
      if (*(int *)(file + 0x2c) <= lVar4) {
        return bVar2;
      }
      bVar1 = HasStringPieceFields((Descriptor *)(lVar3 + *(long *)(file + 0x58)),options);
      lVar3 = lVar3 + 0x88;
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

bool HasStringPieceFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasStringPieceFields(file->message_type(i), options)) return true;
  }
  return false;
}